

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O0

void __thiscall
cppti::HTTPController::routeSpeakers(HTTPController *this,Request *param_1,Response *res)

{
  TalksDB *this_00;
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *__x;
  string_t local_78;
  undefined1 local_48 [8];
  json json;
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> speakers;
  Response *res_local;
  Request *param_1_local;
  HTTPController *this_local;
  
  this_00 = std::reference_wrapper<const_cppti::TalksDB>::get(&this->talksdb);
  __x = TalksDB::getSpeakerList(this_00);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::vector
            ((vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *)
             &json.m_value,__x);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>_&,_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_48,
             (vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *)
             &json.m_value);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_78,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_48,-1,' ',false,strict);
  httplib::Response::set_content(res,&local_78,"application/json");
  std::__cxx11::string::~string((string *)&local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_48);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::~vector
            ((vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *)
             &json.m_value);
  return;
}

Assistant:

void HTTPController::routeSpeakers(Request const&, Response& res)
{
  auto const speakers = this->talksdb.get().getSpeakerList();
  nlohmann::json const json = speakers;
  res.set_content(json.dump(), "application/json");
}